

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sectors.cxx
# Opt level: O2

void __thiscall xray_re::xr_sector_object::load(xr_sector_object *this,xr_reader *r)

{
  uint __line;
  size_t sVar1;
  char *__assertion;
  uint16_t version;
  xr_reader *s;
  
  sVar1 = xr_reader::r_chunk<unsigned_short>(r,0xf010,&version);
  if (sVar1 == 0) {
    __assertion = "0";
    __line = 0x1e;
  }
  else if (version == 0x11) {
    xr_custom_object::load(&this->super_xr_custom_object,r);
    sVar1 = xr_reader::r_chunk<xray_re::_color<float>>
                      (r,0xf020,(_color<float> *)&(this->super_xr_custom_object).field_0x6c);
    if (sVar1 == 0) {
      __assertion = "0";
      __line = 0x22;
    }
    else {
      sVar1 = xr_reader::r_chunk<unsigned_char>(r,0xf025,&this->m_private);
      if (sVar1 != 0) {
        s = xr_reader::open_chunk(r,0xf030);
        if (s != (xr_reader *)0x0) {
          xr_reader::
          r_chunks<std::vector<xray_re::sector_item,std::allocator<xray_re::sector_item>>,read_item>
                    (s,&this->m_items);
          xr_reader::close_chunk(r,&s);
        }
        return;
      }
      __assertion = "0";
      __line = 0x24;
    }
  }
  else {
    __assertion = "version == SECTOR_VERSION";
    __line = 0x1f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sectors.cxx"
                ,__line,"virtual void xray_re::xr_sector_object::load(xr_reader &)");
}

Assistant:

void xr_sector_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(SECTOR_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == SECTOR_VERSION);
	xr_custom_object::load(r);
	if (!r.r_chunk<fcolor>(SECTOR_CHUNK_COLOR, m_color))
		xr_not_expected();
	if (!r.r_chunk<uint8_t>(SECTOR_CHUNK_PRIVATE, m_private))
		xr_not_expected();
	xr_reader* s = r.open_chunk(SECTOR_CHUNK_ITEMS);
	if (s) {
		s->r_chunks(m_items, read_item());
		r.close_chunk(s);
	}
}